

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void multiply10(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int local_d0;
  int argc_local;
  SourceLineInfo local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_b8;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_b8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703ea;
  local_b8.super_ITransientExpression.m_isBinaryExpression = true;
  local_b8.super_ITransientExpression.m_result = false;
  local_b8.super_ITransientExpression._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 8;
  argc_local = argc;
  Catch::StringRef::StringRef(&local_40,"argc == 1");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_d0 = 1;
  local_c8.file = (char *)&argc_local;
  Catch::ExprLhs<int_const&>::operator==(&local_b8,(ExprLhs<int_const&> *)&local_c8,&local_d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  iVar1 = duckdb_shell_sqlite3_value_int(*argv);
  duckdb_shell_sqlite3_result_int(context,iVar1 * 10);
  return;
}

Assistant:

static void multiply10(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	int v = sqlite3_value_int(argv[0]);
	v *= 10;
	sqlite3_result_int(context, v);
}